

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int mem_av_trans_func(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  void **ppvVar1;
  int iVar2;
  bb_t_conflict dst;
  bitmap_el_t *__s2;
  bitmap_t pVVar3;
  VARR_mem_expr_t *pVVar4;
  MIR_insn_t pMVar5;
  bitmap_t pVVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  bb_t_conflict pbVar11;
  bb_t_conflict pbVar12;
  bb_t_conflict pbVar13;
  bb_t_conflict pbVar14;
  MIR_insn_t dst_00;
  ulong uVar15;
  MIR_insn_t mem1;
  bb_t_conflict pbVar16;
  ulong uVar17;
  bb_t_conflict local_48;
  
  dst = (bb_t_conflict)gen_ctx->temp_bitmap;
  bitmap_copy((bitmap_t)dst,bb->out);
  dst_00 = (MIR_insn_t)bb->out;
  pbVar14 = (bb_t_conflict)bb->gen;
  bitmap_copy((bitmap_t)dst_00,(const_bitmap_t)pbVar14);
  if (bb->call_p == '\0') {
    pVVar3 = bb->in;
    if (pVVar3 != (bitmap_t)0x0) {
      pbVar12 = (bb_t_conflict)0x0;
      pbVar11 = bb;
      do {
        uVar10 = (ulong)pbVar12 >> 6;
        uVar17 = pVVar3->els_num;
        bVar7 = true;
        if (uVar10 < uVar17) {
          dst_00 = (MIR_insn_t)pVVar3->varr;
          pbVar14 = (bb_t_conflict)(uVar17 << 6);
          pbVar13 = pbVar12;
LAB_00167715:
          if (((&dst_00->data)[uVar10] == (void *)0x0) ||
             (uVar15 = (ulong)(&dst_00->data)[uVar10] >> ((ulong)pbVar13 & 0x3f), uVar15 == 0))
          goto LAB_00167728;
          uVar17 = uVar15 & 1;
          local_48 = pbVar13;
          while (uVar17 == 0) {
            local_48 = (bb_t_conflict)((long)&local_48->index + 1);
            uVar17 = uVar15 & 2;
            uVar15 = uVar15 >> 1;
          }
          bVar7 = false;
          pbVar12 = (bb_t_conflict)((long)&local_48->index + 1);
        }
LAB_00167763:
        if (bVar7) goto LAB_00167654;
        pVVar4 = gen_ctx->gvn_ctx->mem_exprs;
        if (((pVVar4 == (VARR_mem_expr_t *)0x0) || (pVVar4->varr == (mem_expr_t *)0x0)) ||
           ((bb_t_conflict)pVVar4->els_num <= local_48)) goto LAB_001678ce;
        pMVar5 = pVVar4->varr[(long)local_48]->insn;
        mem1 = pMVar5 + 1;
        if (pMVar5->ops[0].field_0x8 == '\v') {
          mem1 = (MIR_insn_t)pMVar5->ops;
        }
        pVVar6 = bb->gen;
        if (pVVar6 == (bitmap_t)0x0) goto LAB_001678c9;
        pbVar13 = (bb_t_conflict)0x0;
LAB_001677c6:
        uVar10 = (ulong)pbVar13 >> 6;
        uVar17 = pVVar6->els_num;
        bVar7 = true;
        pbVar16 = pbVar13;
        if (uVar10 < uVar17) {
          dst_00 = (MIR_insn_t)pVVar6->varr;
          pbVar14 = (bb_t_conflict)(uVar17 << 6);
LAB_001677e3:
          if (((&dst_00->data)[uVar10] == (void *)0x0) ||
             (uVar15 = (ulong)(&dst_00->data)[uVar10] >> ((ulong)pbVar13 & 0x3f), uVar15 == 0))
          goto LAB_001677f6;
          uVar17 = uVar15 & 1;
          pbVar11 = pbVar13;
          while (uVar17 == 0) {
            pbVar11 = (bb_t_conflict)((long)&pbVar11->index + 1);
            uVar17 = uVar15 & 2;
            uVar15 = uVar15 >> 1;
          }
          bVar7 = false;
          pbVar16 = (bb_t_conflict)((long)&pbVar11->index + 1);
        }
LAB_0016782a:
        if (!bVar7) {
          pVVar4 = gen_ctx->gvn_ctx->mem_exprs;
          if (((pVVar4 == (VARR_mem_expr_t *)0x0) || (pVVar4->varr == (mem_expr_t *)0x0)) ||
             ((bb_t_conflict)pVVar4->els_num <= pbVar11)) goto LAB_001678c4;
          pbVar14 = (bb_t_conflict)pVVar4->varr[(long)pbVar11]->insn;
          if (*(char *)&(pbVar14->bb_link).next == '\v') {
            pbVar14 = (bb_t_conflict)&pbVar14->bb_link;
            dst_00 = mem1;
            iVar8 = may_mem_alias_p((MIR_op_t *)mem1,(MIR_op_t *)pbVar14);
            if (iVar8 != 0) goto LAB_001678b1;
          }
          pbVar13 = pbVar16;
          if (pVVar6 == (bitmap_t)0x0) goto LAB_001678c9;
          goto LAB_001677c6;
        }
        pMVar5 = (MIR_insn_t)bb->out;
        pbVar14 = (bb_t_conflict)((long)&local_48->index + 1);
        dst_00 = pMVar5;
        bitmap_expand((bitmap_t)pMVar5,(size_t)pbVar14);
        if (pMVar5 == (MIR_insn_t)0x0) goto LAB_001678d3;
        ppvVar1 = &((pMVar5->insn_link).next)->data + ((ulong)local_48 >> 6);
        *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << ((ulong)local_48 & 0x3f));
LAB_001678b1:
        if (pVVar3 == (bitmap_t)0x0) break;
      } while( true );
    }
    mem_av_trans_func_cold_7();
LAB_001678c4:
    mem_av_trans_func_cold_1();
LAB_001678c9:
    mem_av_trans_func_cold_3();
LAB_001678ce:
    mem_av_trans_func_cold_4();
LAB_001678d3:
    mem_av_trans_func_cold_2();
  }
  else {
LAB_00167654:
    pbVar11 = (bb_t_conflict)bb->out;
    if (pbVar11 != (bb_t_conflict)0x0) {
      pbVar14 = dst;
      if (dst != (bb_t_conflict)0x0) {
        uVar17 = pbVar11->index;
        uVar10 = dst->index;
        uVar15 = uVar10;
        if (uVar10 < uVar17) {
          pbVar14 = pbVar11;
          pbVar11 = dst;
          uVar15 = uVar17;
          uVar17 = uVar10;
        }
        __s2 = (bitmap_el_t *)pbVar14->rpost;
        iVar8 = bcmp((bitmap_el_t *)pbVar11->rpost,__s2,uVar17 * 8);
        iVar9 = 1;
        if (iVar8 == 0) {
          if (uVar17 < uVar15) {
            do {
              if (__s2[uVar17] != 0) {
                return 1;
              }
              uVar17 = uVar17 + 1;
            } while (uVar15 != uVar17);
          }
          iVar9 = 0;
        }
        return iVar9;
      }
      goto LAB_001678dd;
    }
  }
  mem_av_trans_func_cold_6();
LAB_001678dd:
  mem_av_trans_func_cold_5();
  if ((*(char *)&(dst_00->insn_link).prev != '\v') || ((char)pbVar14->pre != '\v')) {
    __assert_fail("mem1->mode == MIR_OP_VAR_MEM && mem2->mode == MIR_OP_VAR_MEM",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xd72,"int may_mem_alias_p(const MIR_op_t *, const MIR_op_t *)");
  }
  iVar8 = *(int *)((long)&(dst_00->insn_link).next + 4);
  iVar9 = *(int *)((long)&pbVar14->rpost + 4);
  iVar2 = (int)pbVar14->bfs;
  if ((((iVar8 == iVar9) || (iVar8 == 0)) || (iVar8 = 0, iVar9 == 0)) &&
     (iVar8 = 1, iVar2 != 0 && *(int *)&dst_00->field_0x18 != 0)) {
    return (int)(*(int *)&dst_00->field_0x18 != iVar2);
  }
  return iVar8;
LAB_00167728:
  uVar10 = uVar10 + 1;
  pbVar13 = (bb_t_conflict)(uVar10 * 0x40);
  pbVar12 = pbVar14;
  if (uVar17 == uVar10) goto LAB_00167763;
  goto LAB_00167715;
LAB_001677f6:
  uVar10 = uVar10 + 1;
  pbVar13 = (bb_t_conflict)(uVar10 * 0x40);
  pbVar16 = pbVar14;
  if (uVar17 == uVar10) goto LAB_0016782a;
  goto LAB_001677e3;
}

Assistant:

static int mem_av_trans_func (gen_ctx_t gen_ctx, bb_t bb) {
  int alias_p;
  size_t nel, nel2;
  MIR_insn_t insn, mem_insn;
  MIR_op_t *mem_ref;
  bitmap_iterator_t bi, bi2;
  bitmap_t prev_mem_av_out = temp_bitmap;

  bitmap_copy (prev_mem_av_out, bb->mem_av_out);
  bitmap_copy (bb->mem_av_out, bb->gen);
  if (!bb->call_p) {
    FOREACH_BITMAP_BIT (bi, bb->mem_av_in, nel) {
      alias_p = FALSE;
      insn = VARR_GET (mem_expr_t, mem_exprs, nel)->insn;
      mem_ref = insn->ops[0].mode == MIR_OP_VAR_MEM ? &insn->ops[0] : &insn->ops[1];
      FOREACH_BITMAP_BIT (bi2, bb->gen, nel2) { /* consider only stores */
        mem_insn = VARR_GET (mem_expr_t, mem_exprs, nel2)->insn;
        if (mem_insn->ops[0].mode == MIR_OP_VAR_MEM
            && may_mem_alias_p (mem_ref, &mem_insn->ops[0])) {
          alias_p = TRUE;
          break;
        }
      }
      if (!alias_p) bitmap_set_bit_p (bb->mem_av_out, nel);
    }
  }
  return !bitmap_equal_p (bb->mem_av_out, prev_mem_av_out);
}